

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ircbot.cpp
# Opt level: O0

int __thiscall ircBot::init(ircBot *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  ssize_t sVar5;
  ircBot *piVar6;
  stringformatter local_860;
  char local_858 [8];
  string toserver;
  char local_748 [8];
  string join;
  char local_638 [8];
  string nick;
  char local_528 [8];
  string user;
  hostent *he;
  sockaddr_in sa;
  char mybuffer [1000];
  int con;
  ircBot *this_local;
  
  uVar2 = getvar("ircignore");
  piVar6 = (ircBot *)(ulong)uVar2;
  if (uVar2 == 0) {
    do {
      iVar3 = socket(2,1,6);
      this->sock = iVar3;
      he._0_2_ = 2;
      register0x00000000 = gethostbyname(irchost);
      he._4_4_ = *(undefined4 *)*register0x00000000->h_addr_list;
      he._2_2_ = htons((uint16_t)ircport);
      this->connected = false;
      connect(this->sock,(sockaddr *)&he,0x10);
      stringformatter::stringformatter((stringformatter *)(nick + 0x100),local_528);
      stringformatter::operator()
                ((stringformatter *)(nick + 0x100),"USER %s 0 * :%s\r\n",ircbotname);
      iVar3 = this->sock;
      sVar4 = strlen(local_528);
      send(iVar3,local_528,sVar4,0);
      stringformatter::stringformatter((stringformatter *)(join + 0x100),local_638);
      stringformatter::operator()((stringformatter *)(join + 0x100),"NICK %s\r\n",ircbotname);
      iVar3 = this->sock;
      sVar4 = strlen(local_638);
      send(iVar3,local_638,sVar4,0);
      stringformatter::stringformatter((stringformatter *)(toserver + 0x100),local_748);
      stringformatter::operator()((stringformatter *)(toserver + 0x100),"JOIN %s\r\n",ircchan);
      iVar3 = this->sock;
      sVar4 = strlen(local_748);
      send(iVar3,local_748,sVar4,0);
      printf("[ OK ] Initalizing IRC...\n");
      while( true ) {
        sVar5 = recv(this->sock,sa.sin_zero,1000,0);
        ircstring = (int)sVar5;
        if ((this->connected & 1U) == 0) {
          iVar3 = this->sock;
          sVar4 = strlen(local_748);
          send(iVar3,local_748,sVar4,0);
          this->connected = true;
        }
        else {
          this->connected = false;
        }
        if (ircstring == 0) break;
        bVar1 = IsCommand(this,(char *)sa.sin_zero);
        if (!bVar1) {
          stringformatter::stringformatter(&local_860,local_858);
          stringformatter::operator()
                    (&local_860,"\f7%s \f3%s \f7- \f0%s\f7: %s",irchost,ircchan,&this->msg,
                     (this->msg).message);
          server::sendservmsg(local_858);
        }
        memset(sa.sin_zero,0,1000);
      }
      this->connected = false;
      this->connected = false;
      piVar6 = this;
    } while ((this->connected & 1U) == 0);
  }
  return (int)piVar6;
}

Assistant:

void ircBot::init()
{
    if(!getvar("ircignore")) {
    init:
        int con;
        char mybuffer[1000];
        
        struct sockaddr_in sa;
        struct hostent *he;
        
        sock = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
        
        sa.sin_family = AF_INET;
        he = gethostbyname(irchost);
        bcopy(*he->h_addr_list, (char *)&sa.sin_addr.s_addr, sizeof(sa.sin_addr.s_addr));
        sa.sin_port = htons(ircport);
        connected = false;
        con = connect(sock, (struct sockaddr *)&sa, sizeof(sa));
        
        defformatstring(user)("USER %s 0 * :%s\r\n", ircbotname, ircbotname);
        send(sock, user, strlen(user), 0);
        defformatstring(nick)("NICK %s\r\n", ircbotname);
        send(sock, nick, strlen(nick), 0);
        defformatstring(join)("JOIN %s\r\n", ircchan);
        send(sock, join, strlen(join), 0);
        
        printf("[ OK ] Initalizing IRC...\n");
        
        
        while(1){
            ircstring = recv(sock, mybuffer, sizeof(mybuffer), 0);
            if(!connected)
            {
                send(sock, join, strlen(join), 0);
                connected = true;
            } else {
                connected = false;
            }
            
            if(ircstring) {
                if(!IsCommand(mybuffer)){
                    
                    defformatstring(toserver)("\f7%s \f3%s \f7- \f0%s\f7: %s", irchost, ircchan, msg.nick, msg.message);
                    server::sendservmsg(toserver);
                    
                }
            } else {
                connected = false;
                break;
            }
            
            memset(mybuffer,'\0',1000);
        }
        connected = false;
        if(!connected) goto init; //re-initalize after excess flood
    }
}